

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

string * __thiscall
spirv_cross::
join<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2],
          unsigned_long *ts_6,char (*ts_7) [3])

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1128 [4344];
  
  local_1128._4120_8_ = local_1128 + 0x1030;
  local_1128._0_8_ = (char *)0x0;
  local_1128._8_8_ = 0;
  local_1128._16_8_ = 0;
  local_1128._4128_8_ = 0;
  local_1128._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [9])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,ts_1,
             (char (*) [2])ts_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3,
             (char (*) [2])ts_4,(unsigned_long *)ts_5,(char (*) [3])ts_6);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}